

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_chown_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
               sexp_conflict arg1,sexp_conflict arg2)

{
  int iVar1;
  sexp_conflict psVar2;
  undefined8 uVar3;
  __uid_t __owner;
  __gid_t __group;
  
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) {
    if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
      uVar3 = 2;
      arg2 = arg1;
    }
    else {
      if ((((ulong)arg2 & 1) != 0) || ((((ulong)arg2 & 2) == 0 && (arg2->tag == 0xc)))) {
        if (((ulong)arg1 & 1) == 0) {
          if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
            __owner = (__uid_t)(arg1->value).string.length;
          }
          else {
            __owner = 0;
          }
        }
        else {
          __owner = (__uid_t)((long)arg1 >> 1);
        }
        if (((ulong)arg2 & 1) == 0) {
          if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
            __group = (__gid_t)(arg2->value).string.length;
          }
          else {
            __group = 0;
          }
        }
        else {
          __group = (__gid_t)((long)arg2 >> 1);
        }
        iVar1 = chown((((arg0->value).type.cpl)->value).flonum_bits +
                      (long)(((arg0->value).type.name)->value).flonum_bits,__owner,__group);
        psVar2 = (sexp_conflict)sexp_make_integer(ctx,(long)iVar1,(long)(iVar1 >> 0x1f));
        return psVar2;
      }
      uVar3 = 2;
    }
  }
  else {
    uVar3 = 9;
    arg2 = arg0;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,uVar3,arg2);
  return psVar2;
}

Assistant:

sexp sexp_chown_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_integer(ctx, chown(sexp_string_data(arg0), sexp_uint_value(arg1), sexp_uint_value(arg2)));
  return res;
}